

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O2

void __thiscall PrimeExtractor::extract(PrimeExtractor *this)

{
  long step;
  ostream *poVar1;
  long i;
  ulong __n;
  reference rVar2;
  
  step = findNextStep(this);
  do {
    iterateVector(this,step);
    step = findNextStep(this);
    if (step < 1) break;
  } while (step <= this->stopSqrt);
  if (1 < this->stop) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  for (__n = 1; __n < (ulong)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      __n = __n + 1) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->primeCand,__n);
    if ((*rVar2._M_p & rVar2._M_mask) != 0) {
      poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
  }
  return;
}

Assistant:

void PrimeExtractor::extract()
{
    long step = this->findNextStep();
    
    do {
      this->iterateVector(step);
      step = this->findNextStep();
    } while (step > 0 && step <= this->stopSqrt);
    if (this->stop >=2) {
      /**
       * Note: with the procedure described above 2 will never be 
       * calculated but it's prime.
       **/
      std::cout << 2 << std::endl;
    }
    for(long i = 1; i < this->primeCand.size() ; i++) {
      if (this->primeCand[i] == true) {
	  std::cout << i * 2 + 1 << std::endl;
      } 
	
    }
}